

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::SetAsBoolean(ConfigFlagsTable *this,Flag flag,Boolean value)

{
  code *pcVar1;
  bool bVar2;
  Boolean BVar3;
  FlagTypes FVar4;
  Boolean *pBVar5;
  undefined8 *in_FS_OFFSET;
  Flag local_22;
  Boolean childValue;
  Boolean childDefaultValue;
  Flag childFlag;
  Boolean *settingAsBoolean;
  Boolean value_local;
  Flag flag_local;
  ConfigFlagsTable *this_local;
  
  FVar4 = GetFlagType(flag);
  if (FVar4 != FlagBoolean) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x449,"(this->GetFlagType(flag) == FlagBoolean)",
                                "flag not a boolean type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pBVar5 = GetAsBoolean(this,flag);
  if (pBVar5 == (Boolean *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x44c,"(settingAsBoolean != nullptr)","settingAsBoolean != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  Output::VerboseNote(L"FLAG %s = %d\n",*(undefined8 *)(FlagNames + (long)(int)(uint)flag * 8),
                      (ulong)value);
  *pBVar5 = value;
  bVar2 = IsParentFlag(this,flag);
  if (bVar2) {
    for (local_22 = GetNextChildFlag(this,flag,InvalidFlag); local_22 != InvalidFlag;
        local_22 = GetNextChildFlag(this,flag,local_22)) {
      BVar3 = GetDefaultValueAsBoolean(this,local_22);
      if (!value) {
        BVar3 = false;
      }
      Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",
                          *(undefined8 *)(FlagNames + (long)(int)(uint)flag * 8),(ulong)value,
                          *(undefined8 *)(FlagNames + (long)(int)(uint)local_22 * 8),
                          (ulong)(BVar3 != false));
      SetAsBoolean(this,local_22,BVar3 != false);
    }
  }
  if (flag == ES6AllFlag) {
    FlagSetCallback_ES6All(this,value);
  }
  if (flag == ES6ExperimentalFlag) {
    FlagSetCallback_ES6Experimental(this,value);
  }
  return;
}

Assistant:

void
    ConfigFlagsTable::SetAsBoolean(Flag flag, Boolean value)
    {
        AssertMsg(this->GetFlagType(flag) == FlagBoolean, "flag not a boolean type");

        Boolean* settingAsBoolean = this->GetAsBoolean(flag);
        Assert(settingAsBoolean != nullptr);

        Output::VerboseNote(_u("FLAG %s = %d\n"), FlagNames[(int) flag], value);
        *settingAsBoolean = value;

        // check if parent flag
        if (this->IsParentFlag(flag))
        {
            // parent flag, will iterate through all child flags
            Flag childFlag = GetNextChildFlag(flag, /* no currentChildFlag */ InvalidFlag);
            while (childFlag != InvalidFlag)
            {
                Boolean childDefaultValue = GetDefaultValueAsBoolean(childFlag);

                // if the parent flag is TRUE, the children flag values are based on their default values
                // if the parent flag is FALSE, the children flag values are FALSE (always - as disabled)
                Boolean childValue = value == TRUE ? childDefaultValue : FALSE;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) flag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);

                // get next child flag
                childFlag = GetNextChildFlag(flag, /* currentChildFlag */ childFlag);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // in case the flag is marked as 'callback' - to call the method
#define FLAG(type, name, description, defaultValue, parentName, hasCallback) FLAGCALLBACK##hasCallback(type, name)
#define FLAGCALLBACKFALSE(type, name)
#define FLAGCALLBACKTRUE(type, name)    FLAGDOCALLBACK##type(name)

        // define an overload for each FlagTypes - type
            //   * all defaults we don't care about - should assert
#define FLAGDOCALLBACKNumberRange(name)        Assert(false);
#define FLAGDOCALLBACKPhases(name)        Assert(false);
#define FLAGDOCALLBACKString(name)        Assert(false);
#define FLAGDOCALLBACKNumber(name)        Assert(false);
#define FLAGDOCALLBACKNumberSet(name)     Assert(false);
#define FLAGDOCALLBACKNumberPairSet(name) Assert(false);
#define FLAGDOCALLBACKNumberTrioSet(name) Assert(false);
            //   * and those we do care about
#define FLAGDOCALLBACKBoolean(name)       if( flag == name##Flag ) this->FlagSetCallback_##name(value);

#include "ConfigFlagsList.h"

#undef FLAGDOCALLBACKBoolean
#undef FLAGDOCALLBACKNumberRange
#undef FLAGDOCALLBACKNumberPairSet
#undef FLAGDOCALLBACKNumberTrioSet
#undef FLAGDOCALLBACKNumberSet
#undef FLAGDOCALLBACKNumber
#undef FLAGDOCALLBACKString
#undef FLAGDOCALLBACKPhases
#undef FLAGCALLBACKTRUE
#undef FLAGCALLBACKFALSE
#undef FLAG
#endif
    }